

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

int lookup_proto(compiler_state_t *cstate,char *name,int proto)

{
  int iVar1;
  int local_20;
  int v;
  int proto_local;
  char *name_local;
  compiler_state_t *cstate_local;
  
  switch(proto) {
  case 0:
  case 2:
  case 0x11:
    local_20 = pcap_nametoproto(name);
    if (local_20 == -1) {
      bpf_error(cstate,"unknown ip proto \'%s\'",name);
    }
    break;
  case 1:
    local_20 = pcap_nametoeproto(name);
    if ((local_20 == -1) && (local_20 = pcap_nametollc(name), local_20 == -1)) {
      bpf_error(cstate,"unknown ether proto \'%s\'",name);
    }
    break;
  default:
    local_20 = -1;
    break;
  case 0x18:
    iVar1 = strcmp(name,"esis");
    if (iVar1 == 0) {
      local_20 = 0x82;
    }
    else {
      iVar1 = strcmp(name,"isis");
      if (iVar1 == 0) {
        local_20 = 0x83;
      }
      else {
        iVar1 = strcmp(name,"clnp");
        if (iVar1 == 0) {
          local_20 = 0x81;
        }
        else {
          bpf_error(cstate,"unknown osi proto \'%s\'",name);
        }
      }
    }
  }
  return local_20;
}

Assistant:

static int
lookup_proto(compiler_state_t *cstate, const char *name, int proto)
{
	register int v;

	switch (proto) {

	case Q_DEFAULT:
	case Q_IP:
	case Q_IPV6:
		v = pcap_nametoproto(name);
		if (v == PROTO_UNDEF)
			bpf_error(cstate, "unknown ip proto '%s'", name);
		break;

	case Q_LINK:
		/* XXX should look up h/w protocol type based on cstate->linktype */
		v = pcap_nametoeproto(name);
		if (v == PROTO_UNDEF) {
			v = pcap_nametollc(name);
			if (v == PROTO_UNDEF)
				bpf_error(cstate, "unknown ether proto '%s'", name);
		}
		break;

	case Q_ISO:
		if (strcmp(name, "esis") == 0)
			v = ISO9542_ESIS;
		else if (strcmp(name, "isis") == 0)
			v = ISO10589_ISIS;
		else if (strcmp(name, "clnp") == 0)
			v = ISO8473_CLNP;
		else
			bpf_error(cstate, "unknown osi proto '%s'", name);
		break;

	default:
		v = PROTO_UNDEF;
		break;
	}
	return v;
}